

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O0

void __thiscall
rtosc::AutomationMgr::setSlotSubPath(AutomationMgr *this,int slot,int ind,char *path)

{
  bool bVar1;
  Port *pPVar2;
  Automation *pAVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  AutomationMgr *in_RDI;
  float fVar6;
  double dVar7;
  MetaIterator MVar8;
  Automation *au;
  MetaContainer meta;
  Port *port;
  Port *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 uVar9;
  undefined1 uVar10;
  MetaIterator local_68;
  MetaIterator in_stack_ffffffffffffffa8;
  char *local_48;
  char *in_stack_ffffffffffffffc8;
  MetaContainer *this_00;
  Ports *in_stack_ffffffffffffffd8;
  
  if (in_RDI->nslots <= in_ESI) {
    return;
  }
  if (in_ESI < 0) {
    return;
  }
  pcVar5 = local_48;
  pPVar2 = Ports::apropos(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8);
  if (pPVar2 == (Port *)0x0) {
    fprintf(_stderr,"[Zyn:Error] port \'%s\' does not exist\n",in_RCX);
    return;
  }
  Port::meta(in_stack_ffffffffffffff78);
  MVar8 = Port::MetaContainer::find
                    ((MetaContainer *)in_stack_ffffffffffffffa8.value,
                     in_stack_ffffffffffffffa8.title);
  this_00 = (MetaContainer *)MVar8.title;
  bVar1 = Port::MetaIterator::operator_cast_to_bool((MetaIterator *)&stack0xffffffffffffffc8);
  uVar10 = false;
  if (bVar1) {
    MVar8 = Port::MetaContainer::find
                      ((MetaContainer *)in_stack_ffffffffffffffa8.value,
                       in_stack_ffffffffffffffa8.title);
    pcVar5 = MVar8.value;
    uVar10 = Port::MetaIterator::operator_cast_to_bool((MetaIterator *)&local_48);
  }
  if ((((uVar10 ^ 0xff) & 1) != 0) && (pcVar4 = strstr(pPVar2->name,":T"), pcVar4 == (char *)0x0)) {
    fprintf(_stderr,"No bounds for \'%s\' known\n",in_RCX);
    return;
  }
  MVar8 = Port::MetaContainer::find
                    ((MetaContainer *)in_stack_ffffffffffffffa8.value,
                     in_stack_ffffffffffffffa8.title);
  bVar1 = Port::MetaIterator::operator_cast_to_bool((MetaIterator *)&stack0xffffffffffffffa8);
  uVar9 = true;
  if (!bVar1) {
    local_68 = Port::MetaContainer::find((MetaContainer *)MVar8.value,MVar8.title);
    uVar9 = Port::MetaIterator::operator_cast_to_bool(&local_68);
  }
  if ((bool)uVar9 != false) {
    fprintf(_stderr,"[Warning] port \'%s\' is unlearnable\n",in_RCX);
    return;
  }
  in_RDI->slots[in_ESI].used = true;
  pAVar3 = in_RDI->slots[in_ESI].automations + in_EDX;
  pAVar3->used = true;
  pAVar3->active = true;
  pAVar3->param_type = 'i';
  pcVar4 = strstr(pPVar2->name,":f");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = strstr(pPVar2->name,":T");
    if (pcVar4 != (char *)0x0) {
      pAVar3->param_type = 'T';
    }
  }
  else {
    pAVar3->param_type = 'f';
  }
  if (pAVar3->param_type == 'T') {
    pAVar3->param_min = 0.0;
    pAVar3->param_max = 1.0;
  }
  else {
    pcVar4 = Port::MetaContainer::operator[](this_00,pcVar5);
    dVar7 = atof(pcVar4);
    pAVar3->param_min = (float)dVar7;
    pcVar4 = Port::MetaContainer::operator[](this_00,pcVar5);
    dVar7 = atof(pcVar4);
    pAVar3->param_max = (float)dVar7;
  }
  fast_strcpy((char *)CONCAT17(uVar10,CONCAT16(uVar9,in_stack_ffffffffffffff80)),
              (char *)in_stack_ffffffffffffff78,0x126f26);
  pcVar4 = Port::MetaContainer::operator[](this_00,pcVar5);
  if (pcVar4 != (char *)0x0) {
    pcVar4 = Port::MetaContainer::operator[](this_00,pcVar5);
    pcVar4 = strstr(pcVar4,"log");
    if (pcVar4 != (char *)0x0) {
      (pAVar3->map).control_scale = 1;
      pcVar4 = Port::MetaContainer::operator[](this_00,pcVar5);
      if (pcVar4 == (char *)0x0) {
        dVar7 = (double)pAVar3->param_min;
      }
      else {
        pcVar5 = Port::MetaContainer::operator[](this_00,pcVar5);
        dVar7 = atof(pcVar5);
      }
      fVar6 = logf((float)dVar7);
      pAVar3->param_min = fVar6;
      fVar6 = logf(pAVar3->param_max);
      pAVar3->param_max = fVar6;
      goto LAB_00127012;
    }
  }
  (pAVar3->map).control_scale = 0;
LAB_00127012:
  updateMapping(in_RDI,in_ESI,in_EDX);
  in_RDI->damaged = 1;
  return;
}

Assistant:

void AutomationMgr::setSlotSubPath(int slot, int ind, const char *path)
{
    if(slot >= nslots || slot < 0)
        return;

    assert(p);
    const Port *port = p->apropos(path);
    if(!port) {
        fprintf(stderr, "[Zyn:Error] port '%s' does not exist\n", path);
        return;
    }
    auto meta = port->meta();
    if(!(meta.find("min") && meta.find("max"))) {
        if(!strstr(port->name, ":T")) {
            fprintf(stderr, "No bounds for '%s' known\n", path);
            return;
        }
    }
    if(meta.find("internal") || meta.find("no learn")) {
        fprintf(stderr, "[Warning] port '%s' is unlearnable\n", path);
        return;
    }

    slots[slot].used = true;

    auto &au = slots[slot].automations[ind];

    au.used   = true;
    au.active = true;
    au.param_type = 'i';
    if(strstr(port->name, ":f"))
        au.param_type = 'f';
    else if(strstr(port->name, ":T"))
        au.param_type = 'T';
    if(au.param_type == 'T') {
        au.param_min = 0.0;
        au.param_max = 1.0;
    } else {
        au.param_min = atof(meta["min"]);
        au.param_max = atof(meta["max"]);
    }
    fast_strcpy(au.param_path, path, sizeof(au.param_path));

    if(meta["scale"] && strstr(meta["scale"], "log")) {
        au.map.control_scale = 1;
        au.param_min = logf(meta["logmin"] ? atof(meta["logmin"]) : au.param_min);
        au.param_max = logf(au.param_max);
    } else
        au.map.control_scale = 0;

    updateMapping(slot, ind);
    damaged = true;
}